

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::UnknownFieldSetTest::~UnknownFieldSetTest(UnknownFieldSetTest *this)

{
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__UnknownFieldSetTest_0163f960;
  internal::ZeroFieldsBase::~ZeroFieldsBase(&(this->empty_message_).super_ZeroFieldsBase);
  std::__cxx11::string::~string((string *)&this->all_fields_data_);
  proto2_unittest::TestAllTypes::~TestAllTypes(&this->all_fields_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

void SetUp() override {
    descriptor_ = unittest::TestAllTypes::descriptor();
    TestUtil::SetAllFields(&all_fields_);
    all_fields_.SerializeToString(&all_fields_data_);
    ASSERT_TRUE(empty_message_.ParseFromString(all_fields_data_));
    unknown_fields_ = empty_message_.mutable_unknown_fields();
  }